

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O2

int cubeb_device_collection_destroy(cubeb *context,cubeb_device_collection *collection)

{
  _func_int_cubeb_ptr_cubeb_device_collection_ptr *p_Var1;
  int iVar2;
  
  if (collection == (cubeb_device_collection *)0x0 || context == (cubeb *)0x0) {
    return -3;
  }
  p_Var1 = context->ops->device_collection_destroy;
  if (p_Var1 == (_func_int_cubeb_ptr_cubeb_device_collection_ptr *)0x0) {
    iVar2 = -4;
  }
  else {
    iVar2 = 0;
    if (collection->device != (cubeb_device_info *)0x0) {
      iVar2 = (*p_Var1)(context,collection);
      if (iVar2 == 0) {
        collection->device = (cubeb_device_info *)0x0;
        collection->count = 0;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int
cubeb_device_collection_destroy(cubeb * context,
                                cubeb_device_collection * collection)
{
  int r;

  if (context == NULL || collection == NULL)
    return CUBEB_ERROR_INVALID_PARAMETER;

  if (!context->ops->device_collection_destroy)
    return CUBEB_ERROR_NOT_SUPPORTED;

  if (!collection->device)
    return CUBEB_OK;

  r = context->ops->device_collection_destroy(context, collection);
  if (r == CUBEB_OK) {
    collection->device = NULL;
    collection->count = 0;
  }

  return r;
}